

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

uint nullcDebugGetStackFrameCount(void)

{
  uint uVar1;
  uint frame;
  
  frame = 0;
  uVar1 = nullcDebugEnumStackFrame(0);
  if (uVar1 != 0) {
    frame = 0;
    do {
      frame = frame + 1;
      uVar1 = nullcDebugEnumStackFrame(frame);
    } while (uVar1 != 0);
  }
  return frame;
}

Assistant:

unsigned int nullcDebugGetStackFrameCount()
{
	using namespace NULLC;

	unsigned callStackSize = 0;

	unsigned currentFrame = 0;
	while(nullcDebugEnumStackFrame(currentFrame++))
		callStackSize++;

	return callStackSize;
}